

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins_exts.c
# Opt level: O0

LY_ERR lyplg_ext_parse_extension_instance(lysp_ctx *pctx,lysp_ext_instance *ext)

{
  char *pcVar1;
  lysp_stmt *local_90;
  char *local_80;
  ly_ctx *local_58;
  lysp_stmt *local_50;
  lysp_stmt *local_40;
  lysp_stmt *local_30;
  lysp_stmt *stmt;
  uint64_t u;
  LY_ERR rc;
  lysp_ext_instance *ext_local;
  lysp_ctx *pctx_local;
  
  u._4_4_ = LY_SUCCESS;
  local_30 = ext->child;
  do {
    if (local_30 == (lysp_stmt *)0x0) {
      stmt = (lysp_stmt *)0x0;
      while( true ) {
        if (ext->substmts == (lysp_ext_substmt *)0x0) {
          local_90 = (lysp_stmt *)0x0;
        }
        else {
          local_90 = (lysp_stmt *)ext->substmts[-1].storage_p;
        }
        if (local_90 <= stmt) break;
        for (local_30 = ext->child; local_30 != (lysp_stmt *)0x0; local_30 = local_30->next) {
          if ((ext->substmts[(long)stmt].stmt == local_30->kw) &&
             (u._4_4_ = lys_parser_ext_instance_stmt(pctx,ext->substmts + (long)stmt,local_30),
             u._4_4_ != LY_SUCCESS)) {
            return u._4_4_;
          }
        }
        stmt = (lysp_stmt *)((long)&stmt->stmt + 1);
      }
      return u._4_4_;
    }
    if ((local_30->flags & 0xc00) == 0) {
      stmt = (lysp_stmt *)0x0;
      while( true ) {
        if (ext->substmts == (lysp_ext_substmt *)0x0) {
          local_40 = (lysp_stmt *)0x0;
        }
        else {
          local_40 = (lysp_stmt *)ext->substmts[-1].storage_p;
        }
        if ((local_40 <= stmt) || (ext->substmts[(long)stmt].stmt == local_30->kw)) break;
        stmt = (lysp_stmt *)((long)&stmt->stmt + 1);
      }
      if (ext->substmts == (lysp_ext_substmt *)0x0) {
        local_50 = (lysp_stmt *)0x0;
      }
      else {
        local_50 = (lysp_stmt *)ext->substmts[-1].storage_p;
      }
      if (stmt == local_50) {
        if (pctx == (lysp_ctx *)0x0) {
          local_58 = (ly_ctx *)0x0;
        }
        else {
          local_58 = (ly_ctx *)
                     **(undefined8 **)
                       (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
        }
        pcVar1 = "\t";
        if (ext->argument != (char *)0x0) {
          pcVar1 = ", ";
        }
        if (ext->argument == (char *)0x0) {
          local_80 = "";
        }
        else {
          local_80 = ext->argument;
        }
        ly_vlog(local_58,(char *)0x0,LYVE_SYNTAX_YANG,
                "Invalid keyword \"%s\" as a child of \"%s%s%s\" extension instance.",local_30->stmt
                ,ext->name,pcVar1 + 1,local_80);
        return LY_EVALID;
      }
    }
    local_30 = local_30->next;
  } while( true );
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyplg_ext_parse_extension_instance(struct lysp_ctx *pctx, struct lysp_ext_instance *ext)
{
    LY_ERR rc = LY_SUCCESS;
    LY_ARRAY_COUNT_TYPE u;
    struct lysp_stmt *stmt;

    /* check for invalid substatements */
    LY_LIST_FOR(ext->child, stmt) {
        if (stmt->flags & (LYS_YIN_ATTR | LYS_YIN_ARGUMENT)) {
            continue;
        }
        LY_ARRAY_FOR(ext->substmts, u) {
            if (ext->substmts[u].stmt == stmt->kw) {
                break;
            }
        }
        if (u == LY_ARRAY_COUNT(ext->substmts)) {
            LOGVAL(PARSER_CTX(pctx), LYVE_SYNTAX_YANG, "Invalid keyword \"%s\" as a child of \"%s%s%s\" extension instance.",
                    stmt->stmt, ext->name, ext->argument ? " " : "", ext->argument ? ext->argument : "");
            rc = LY_EVALID;
            goto cleanup;
        }
    }

    /* parse all the known statements */
    LY_ARRAY_FOR(ext->substmts, u) {
        LY_LIST_FOR(ext->child, stmt) {
            if (ext->substmts[u].stmt != stmt->kw) {
                continue;
            }

            if ((rc = lys_parser_ext_instance_stmt(pctx, &ext->substmts[u], stmt))) {
                goto cleanup;
            }
        }
    }

cleanup:
    return rc;
}